

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O0

set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *
findRationalSolutions
          (set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>
           *__return_storage_ptr__,Polynomial *polynomial)

{
  RationalNum *pRVar1;
  longlong numerator_;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference plVar5;
  long lVar6;
  RationalNum RVar7;
  pair<std::_Rb_tree_const_iterator<RationalNum>,_bool> pVar8;
  RationalNum local_208;
  RationalNum local_1f8;
  RationalNum local_1e8;
  RationalNum local_1d8;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  RationalNum local_1b8;
  RationalNum local_1a8;
  RationalNum local_198;
  RationalNum local_188;
  _Base_ptr local_178;
  undefined1 local_170;
  RationalNum local_168;
  longlong local_158;
  longlong lStack_150;
  RationalNum local_148;
  undefined1 auStack_138 [8];
  RationalNum x;
  longlong q;
  iterator __end2;
  iterator __begin2;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *__range2;
  longlong p;
  iterator __end1;
  iterator __begin1;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *__range1;
  undefined1 local_e0 [8];
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> qValues;
  RationalNum local_70;
  uint local_5c;
  undefined1 local_58 [4];
  int i_1;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> pValues;
  long lStack_20;
  int i;
  longlong commonDenominator;
  Polynomial *polynomial_local;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *rationalSolutions;
  
  lStack_20 = 1;
  for (pValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      pValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= polynomial->degree;
      pValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           pValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    iVar3 = RationalNum::getDenominator
                      (polynomial->coefficients +
                       (int)pValues._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    lStack_20 = iVar3 * lStack_20;
  }
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set
            ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_58);
  local_5c = 0;
  do {
    if (polynomial->degree < local_5c) {
LAB_0013528c:
      iVar3 = RationalNum::getNumerator(polynomial->coefficients + polynomial->degree);
      iVar4 = RationalNum::getDenominator(polynomial->coefficients + polynomial->degree);
      getDivisors((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_e0,
                  (long)iVar3 * (lStack_20 / (long)iVar4));
      std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::set
                (__return_storage_ptr__);
      __end1 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::begin
                         ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
                          local_58);
      p = (longlong)
          std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::end
                    ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_58);
      while( true ) {
        bVar2 = std::operator!=(&__end1,(_Self *)&p);
        if (!bVar2) break;
        plVar5 = std::_Rb_tree_const_iterator<long_long>::operator*(&__end1);
        numerator_ = *plVar5;
        __end2 = std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::begin
                           ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
                            local_e0);
        q = (longlong)
            std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::end
                      ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_e0)
        ;
        while( true ) {
          bVar2 = std::operator!=(&__end2,(_Self *)&q);
          if (!bVar2) break;
          plVar5 = std::_Rb_tree_const_iterator<long_long>::operator*(&__end2);
          x.denominator = *plVar5;
          RationalNum::RationalNum((RationalNum *)auStack_138,numerator_,x.denominator);
          local_158 = (longlong)auStack_138;
          lStack_150 = x.numerator;
          RVar7.denominator = x.numerator;
          RVar7.numerator = (longlong)auStack_138;
          RVar7 = getPolynomialValue(polynomial,RVar7);
          local_148 = RVar7;
          RationalNum::RationalNum(&local_168,0,1);
          bVar2 = operator==(&local_148,&local_168);
          if (bVar2) {
            pVar8 = std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::
                    insert(__return_storage_ptr__,(value_type *)auStack_138);
            local_178 = (_Base_ptr)pVar8.first._M_node;
            local_170 = pVar8.second;
          }
          RVar7 = RationalNum::operator-((RationalNum *)auStack_138);
          local_198 = RVar7;
          RVar7 = getPolynomialValue(polynomial,RVar7);
          local_188 = RVar7;
          RationalNum::RationalNum(&local_1a8,0,1);
          bVar2 = operator==(&local_188,&local_1a8);
          if (bVar2) {
            RVar7 = RationalNum::operator-((RationalNum *)auStack_138);
            local_1b8 = RVar7;
            pVar8 = std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::
                    insert(__return_storage_ptr__,&local_1b8);
            local_1c8 = (_Base_ptr)pVar8.first._M_node;
            local_1c0 = pVar8.second;
          }
          std::_Rb_tree_const_iterator<long_long>::operator++(&__end2);
        }
        std::_Rb_tree_const_iterator<long_long>::operator++(&__end1);
      }
      RationalNum::RationalNum(&local_1e8,0,1);
      local_1d8 = getPolynomialValue(polynomial,local_1e8);
      RationalNum::RationalNum(&local_1f8,0,1);
      bVar2 = operator==(&local_1d8,&local_1f8);
      if (bVar2) {
        RationalNum::RationalNum(&local_208,0,1);
        std::set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_>::insert
                  (__return_storage_ptr__,&local_208);
      }
      std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
                ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_e0);
      std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
                ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_58);
      return __return_storage_ptr__;
    }
    pRVar1 = polynomial->coefficients;
    lVar6 = (long)(int)local_5c;
    RationalNum::RationalNum(&local_70,0,1);
    bVar2 = operator!=(pRVar1 + lVar6,&local_70);
    if (bVar2) {
      iVar3 = RationalNum::getNumerator(polynomial->coefficients + (int)local_5c);
      iVar4 = RationalNum::getDenominator(polynomial->coefficients);
      getDivisors((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
                  &qValues._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (long)iVar3 * (lStack_20 / (long)iVar4));
      std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::operator=
                ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)local_58,
                 (set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
                 &qValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
                ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
                 &qValues._M_t._M_impl.super__Rb_tree_header._M_node_count);
      goto LAB_0013528c;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

set<RationalNum> findRationalSolutions(Polynomial* polynomial) {
    long long int commonDenominator = 1;
    for(int i = 0; i <= polynomial->degree; i++) commonDenominator *= polynomial->coefficients[i].getDenominator();

    set<long long int> pValues;
    for(int i = 0; i <= polynomial->degree; i++) {
        if(polynomial->coefficients[i] != 0ll) {
            pValues = getDivisors(polynomial->coefficients[i].getNumerator() * (commonDenominator / polynomial->coefficients[0].getDenominator()));
            break;
        }
    }
    set<long long int> qValues = getDivisors(polynomial->coefficients[polynomial->degree].getNumerator() * (commonDenominator / polynomial->coefficients[polynomial->degree].getDenominator()));

    set<RationalNum> rationalSolutions;
    for(auto p : pValues) {
        for(auto q : qValues) {
            RationalNum x(p, q);
            if(getPolynomialValue(polynomial, x) == 0ll) rationalSolutions.insert(x);
            if(getPolynomialValue(polynomial, -x) == 0ll) rationalSolutions.insert(-x);
        }
    }
    if(getPolynomialValue(polynomial, 0ll) == 0ll) rationalSolutions.insert(0ll);

    return rationalSolutions;
}